

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

string * __thiscall
Highs::presolveStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,Highs *this,HighsPresolveStatus presolve_status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(presolve_status) {
  case kNotReduced:
    pcVar2 = "Not reduced";
    paVar1 = &local_a;
    break;
  case kInfeasible:
    pcVar2 = "Infeasible";
    paVar1 = &local_b;
    break;
  case kUnboundedOrInfeasible:
    pcVar2 = "Unbounded or infeasible";
    paVar1 = &local_c;
    break;
  case kReduced:
    pcVar2 = "Reduced";
    paVar1 = &local_d;
    break;
  case kReducedToEmpty:
    pcVar2 = "Reduced to empty";
    paVar1 = &local_e;
    break;
  case kTimeout:
    pcVar2 = "Timeout";
    paVar1 = &local_f;
    break;
  default:
    pcVar2 = "Unrecognised presolve status";
    paVar1 = &local_11;
    break;
  case kOutOfMemory:
    pcVar2 = "Memory allocation error";
    paVar1 = &local_10;
    break;
  case kNotPresolved:
    pcVar2 = "Not presolved";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Highs::presolveStatusToString(
    const HighsPresolveStatus presolve_status) const {
  switch (presolve_status) {
    case HighsPresolveStatus::kNotPresolved:
      return "Not presolved";
    case HighsPresolveStatus::kNotReduced:
      return "Not reduced";
    case HighsPresolveStatus::kInfeasible:
      return "Infeasible";
    case HighsPresolveStatus::kUnboundedOrInfeasible:
      return "Unbounded or infeasible";
    case HighsPresolveStatus::kReduced:
      return "Reduced";
    case HighsPresolveStatus::kReducedToEmpty:
      return "Reduced to empty";
    case HighsPresolveStatus::kTimeout:
      return "Timeout";
    case HighsPresolveStatus::kOutOfMemory:
      return "Memory allocation error";
    default:
      assert(1 == 0);
      return "Unrecognised presolve status";
  }
}